

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ReadFaces_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData)

{
  float fVar1;
  ushort uVar2;
  uint uVar3;
  uchar *puVar4;
  bool bVar5;
  Logger *pLVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  float fVar10;
  float v_1;
  float u_1;
  float v;
  float u;
  aiVector3D *vNormal_1;
  aiVector3D *vNormal;
  aiVector3D *vPosition;
  uint iIndex;
  uint c;
  uint iTriangle;
  uint iOutIndex;
  Triangle_MDL7 *pcGroupTris;
  Header_MDL7 *pcHeader;
  IntGroupData_MDL7 *groupData_local;
  IntGroupInfo_MDL7 *groupInfo_local;
  MDLImporter *this_local;
  
  puVar4 = this->mBuffer;
  _iTriangle = groupInfo->pcGroupTris;
  c = 0;
  iIndex = 0;
  do {
    if ((uint)groupInfo->pcGroup->numtris <= iIndex) {
      return;
    }
    for (vPosition._4_4_ = 0; vPosition._4_4_ < 3; vPosition._4_4_ = vPosition._4_4_ + 1) {
      vPosition._0_4_ = (uint)_iTriangle->v_index[vPosition._4_4_];
      if ((uint)groupInfo->pcGroup->numverts < (uint)vPosition) {
        vPosition._0_4_ = groupInfo->pcGroup->numverts - 1;
        _iTriangle->v_index[vPosition._4_4_] = (uint16_t)(uint)vPosition;
        pLVar6 = DefaultLogger::get();
        Logger::warn(pLVar6,"Index overflow in MDL7 vertex list");
      }
      pvVar7 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::
               operator[](&groupData->pcFaces,(ulong)iIndex);
      pvVar7->mIndices[2 - vPosition._4_4_] = c;
      pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (&groupData->vPositions,(ulong)c);
      pvVar8->x = *(float *)((long)&groupInfo->pcGroupVerts->x +
                            (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)));
      pvVar8->y = *(float *)((long)&groupInfo->pcGroupVerts->y +
                            (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)));
      pvVar8->z = *(float *)((long)&groupInfo->pcGroupVerts->z +
                            (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)));
      bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&groupData->aiBones);
      if (!bVar5) {
        uVar2 = *(ushort *)
                 ((long)&groupInfo->pcGroupVerts->vertindex +
                 (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)));
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&groupData->aiBones,(ulong)c);
        *pvVar9 = (uint)uVar2;
      }
      if (*(ushort *)(puVar4 + 0x28) < 0x1a) {
        if (0xf < *(ushort *)(puVar4 + 0x28)) {
          pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (&groupData->vNormals,(ulong)c);
          MD2::LookupNormalIndex
                    (*(uint8_t *)
                      ((long)&groupInfo->pcGroupVerts->field_4 +
                      (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28))),pvVar8);
        }
      }
      else {
        pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           (&groupData->vNormals,(ulong)c);
        pvVar8->x = *(float *)((long)&groupInfo->pcGroupVerts->field_4 +
                              (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)));
        pvVar8->y = *(float *)((long)&groupInfo->pcGroupVerts->field_4 +
                              (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)) + 4);
        pvVar8->z = *(float *)((long)&groupInfo->pcGroupVerts->field_4 +
                              (ulong)((uint)vPosition * *(ushort *)(puVar4 + 0x28)) + 8);
      }
      if (0xb < *(ushort *)(puVar4 + 0x26)) {
        if (groupInfo->pcGroup->num_stpts != 0) {
          vPosition._0_4_ = (uint)_iTriangle->skinsets[0].st_index[vPosition._4_4_];
          if ((uint)groupInfo->pcGroup->num_stpts < (uint)vPosition) {
            vPosition._0_4_ = groupInfo->pcGroup->num_stpts - 1;
            pLVar6 = DefaultLogger::get();
            Logger::warn(pLVar6,"Index overflow in MDL7 UV coordinate list (#1)");
          }
          fVar1 = groupInfo->pcGroupUVs[(uint)vPosition].u;
          fVar10 = groupInfo->pcGroupUVs[(uint)vPosition].v;
          pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (&groupData->vTextureCoords1,(ulong)c);
          pvVar8->x = fVar1;
          pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (&groupData->vTextureCoords1,(ulong)c);
          pvVar8->y = 1.0 - fVar10;
        }
        if (0xf < *(ushort *)(puVar4 + 0x26)) {
          uVar3 = _iTriangle->skinsets[0].material;
          pvVar7 = std::
                   vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::
                   operator[](&groupData->pcFaces,(ulong)iIndex);
          pvVar7->iMatIndex[0] = uVar3;
        }
      }
      if (0x19 < *(ushort *)(puVar4 + 0x26)) {
        if (groupInfo->pcGroup->num_stpts != 0) {
          vPosition._0_4_ = (uint)_iTriangle->skinsets[1].st_index[vPosition._4_4_];
          if ((uint)groupInfo->pcGroup->num_stpts < (uint)vPosition) {
            vPosition._0_4_ = groupInfo->pcGroup->num_stpts - 1;
            pLVar6 = DefaultLogger::get();
            Logger::warn(pLVar6,"Index overflow in MDL7 UV coordinate list (#2)");
          }
          fVar1 = groupInfo->pcGroupUVs[(uint)vPosition].u;
          fVar10 = 1.0 - groupInfo->pcGroupUVs[(uint)vPosition].v;
          pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (&groupData->vTextureCoords2,(ulong)c);
          pvVar8->x = fVar1;
          pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (&groupData->vTextureCoords2,(ulong)c);
          pvVar8->y = fVar10;
          if ((uint)vPosition != 0) {
            pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                               (&groupData->vTextureCoords1,(ulong)c);
            if ((fVar1 == pvVar8->x) && (!NAN(fVar1) && !NAN(pvVar8->x))) {
              pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                       operator[](&groupData->vTextureCoords1,(ulong)c);
              if ((fVar10 == pvVar8->y) && (!NAN(fVar10) && !NAN(pvVar8->y))) goto LAB_00719f52;
            }
            groupData->bNeed2UV = true;
          }
LAB_00719f52:
          if (_iTriangle->skinsets[1].material != _iTriangle->skinsets[0].material) {
            groupData->bNeed2UV = true;
          }
        }
        uVar3 = _iTriangle->skinsets[1].material;
        pvVar7 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ::operator[](&groupData->pcFaces,(ulong)iIndex);
        pvVar7->iMatIndex[1] = uVar3;
      }
      c = c + 1;
    }
    _iTriangle = (Triangle_MDL7 *)
                 ((long)_iTriangle->v_index + (long)(int)(uint)*(ushort *)(puVar4 + 0x26));
    iIndex = iIndex + 1;
  } while( true );
}

Assistant:

void MDLImporter::ReadFaces_3DGS_MDL7(const MDL::IntGroupInfo_MDL7& groupInfo,
    MDL::IntGroupData_MDL7& groupData)
{
    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    MDL::Triangle_MDL7* pcGroupTris = groupInfo.pcGroupTris;

    // iterate through all triangles and build valid display lists
    unsigned int iOutIndex = 0;
    for (unsigned int iTriangle = 0; iTriangle < (unsigned int)groupInfo.pcGroup->numtris; ++iTriangle) {
        AI_SWAP2(pcGroupTris->v_index[0]);
        AI_SWAP2(pcGroupTris->v_index[1]);
        AI_SWAP2(pcGroupTris->v_index[2]);

        // iterate through all indices of the current triangle
        for (unsigned int c = 0; c < 3;++c,++iOutIndex) {

            // validate the vertex index
            unsigned int iIndex = pcGroupTris->v_index[c];
            if(iIndex > (unsigned int)groupInfo.pcGroup->numverts)  {
                // (we might need to read this section a second time - to process frame vertices correctly)
                pcGroupTris->v_index[c] = iIndex = groupInfo.pcGroup->numverts-1;
                ASSIMP_LOG_WARN("Index overflow in MDL7 vertex list");
            }

            // write the output face index
            groupData.pcFaces[iTriangle].mIndices[2-c] = iOutIndex;

            aiVector3D& vPosition = groupData.vPositions[ iOutIndex ];
            vPosition.x = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex, pcHeader->mainvertex_stc_size) .x;
            vPosition.y = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .y;
            vPosition.z = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .z;

            // if we have bones, save the index
            if (!groupData.aiBones.empty()) {
                groupData.aiBones[iOutIndex] = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,
                    iIndex,pcHeader->mainvertex_stc_size).vertindex;
            }

            // now read the normal vector
            if (AI_MDL7_FRAMEVERTEX030305_STCSIZE <= pcHeader->mainvertex_stc_size) {
                // read the full normal vector
                aiVector3D& vNormal = groupData.vNormals[ iOutIndex ];
                vNormal.x = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .norm[0];
                AI_SWAP4(vNormal.x);
                vNormal.y = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .norm[1];
                AI_SWAP4(vNormal.y);
                vNormal.z = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .norm[2];
                AI_SWAP4(vNormal.z);
            }
            else if (AI_MDL7_FRAMEVERTEX120503_STCSIZE <= pcHeader->mainvertex_stc_size)    {
                // read the normal vector from Quake2's smart table
                aiVector3D& vNormal = groupData.vNormals[ iOutIndex ];
                MD2::LookupNormalIndex(_AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,
                    pcHeader->mainvertex_stc_size) .norm162index,vNormal);
            }
            // validate and process the first uv coordinate set
            if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_ONE_UV)    {

                if (groupInfo.pcGroup->num_stpts)   {
                    AI_SWAP2(pcGroupTris->skinsets[0].st_index[0]);
                    AI_SWAP2(pcGroupTris->skinsets[0].st_index[1]);
                    AI_SWAP2(pcGroupTris->skinsets[0].st_index[2]);

                    iIndex = pcGroupTris->skinsets[0].st_index[c];
                    if(iIndex > (unsigned int)groupInfo.pcGroup->num_stpts) {
                        iIndex = groupInfo.pcGroup->num_stpts-1;
                        ASSIMP_LOG_WARN("Index overflow in MDL7 UV coordinate list (#1)");
                    }

                    float u = groupInfo.pcGroupUVs[iIndex].u;
                    float v = 1.0f-groupInfo.pcGroupUVs[iIndex].v; // DX to OGL

                    groupData.vTextureCoords1[iOutIndex].x = u;
                    groupData.vTextureCoords1[iOutIndex].y = v;
                }
                // assign the material index, but only if it is existing
                if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_ONE_UV_WITH_MATINDEX){
                    AI_SWAP4(pcGroupTris->skinsets[0].material);
                    groupData.pcFaces[iTriangle].iMatIndex[0] = pcGroupTris->skinsets[0].material;
                }
            }
            // validate and process the second uv coordinate set
            if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_TWO_UV)    {

                if (groupInfo.pcGroup->num_stpts)   {
                    AI_SWAP2(pcGroupTris->skinsets[1].st_index[0]);
                    AI_SWAP2(pcGroupTris->skinsets[1].st_index[1]);
                    AI_SWAP2(pcGroupTris->skinsets[1].st_index[2]);
                    AI_SWAP4(pcGroupTris->skinsets[1].material);

                    iIndex = pcGroupTris->skinsets[1].st_index[c];
                    if(iIndex > (unsigned int)groupInfo.pcGroup->num_stpts) {
                        iIndex = groupInfo.pcGroup->num_stpts-1;
                        ASSIMP_LOG_WARN("Index overflow in MDL7 UV coordinate list (#2)");
                    }

                    float u = groupInfo.pcGroupUVs[ iIndex ].u;
                    float v = 1.0f-groupInfo.pcGroupUVs[ iIndex ].v;

                    groupData.vTextureCoords2[ iOutIndex ].x = u;
                    groupData.vTextureCoords2[ iOutIndex ].y = v; // DX to OGL

                    // check whether we do really need the second texture
                    // coordinate set ... wastes memory and loading time
                    if (0 != iIndex && (u != groupData.vTextureCoords1[ iOutIndex ].x ||
                        v != groupData.vTextureCoords1[ iOutIndex ].y ) )
                        groupData.bNeed2UV = true;

                    // if the material differs, we need a second skin, too
                    if (pcGroupTris->skinsets[ 1 ].material != pcGroupTris->skinsets[ 0 ].material)
                        groupData.bNeed2UV = true;
                }
                // assign the material index
                groupData.pcFaces[ iTriangle ].iMatIndex[ 1 ] = pcGroupTris->skinsets[ 1 ].material;
            }
        }
        // get the next triangle in the list
        pcGroupTris = (MDL::Triangle_MDL7*)((const char*)pcGroupTris + pcHeader->triangle_stc_size);
    }
}